

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_unix_util.c
# Opt level: O2

PaError PaUnixMutex_Unlock(PaUnixMutex *self)

{
  int __errnum;
  PaError PVar1;
  int iVar2;
  pthread_t __thread1;
  char *errorText;
  
  __errnum = pthread_mutex_unlock((pthread_mutex_t *)self);
  PVar1 = 0;
  paUtilErr_ = __errnum;
  if (__errnum != 0) {
    __thread1 = pthread_self();
    iVar2 = pthread_equal(__thread1,paUnixMainThread);
    if (iVar2 != 0) {
      errorText = strerror(__errnum);
      PaUtil_SetLastHostErrorInfo(paALSA,(long)__errnum,errorText);
    }
    PaUtil_DebugPrint(
                     "Expression \'pthread_mutex_unlock( &self->mtx )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/os/unix/pa_unix_util.c\', line: 541\n"
                     );
    PVar1 = -9999;
  }
  return PVar1;
}

Assistant:

PaError PaUnixMutex_Unlock( PaUnixMutex* self )
{
    PaError result = paNoError;

    PA_ENSURE_SYSTEM( pthread_mutex_unlock( &self->mtx ), 0 );
#ifdef PTHREAD_CANCEL
	int oldState;
    PA_ENSURE_SYSTEM( pthread_setcancelstate( PTHREAD_CANCEL_ENABLE, &oldState ), 0 );
#endif

error:
    return result;
}